

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_compute_update_aspa_table
              (rtr_socket *rtr_socket,aspa_table *aspa_table,pdu_aspa **aspa_pdus,size_t pdu_count,
              aspa_update **update)

{
  pdu_aspa *pdu_00;
  aspa_status aVar1;
  aspa_update_operation *operations_00;
  size_t sVar2;
  long in_FS_OFFSET;
  pdu_aspa *local_b0;
  uint local_a4;
  size_t pdu_size;
  pdu_aspa *pdu;
  ulong uStack_88;
  aspa_status res;
  size_t i;
  aspa_update_operation *operations;
  aspa_update **update_local;
  size_t pdu_count_local;
  pdu_aspa **aspa_pdus_local;
  aspa_table *aspa_table_local;
  rtr_socket *rtr_socket_local;
  char local_38 [8];
  char txt_1 [17];
  char local_1e [8];
  char txt [14];
  
  txt._6_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x42a,
                  "int rtr_compute_update_aspa_table(struct rtr_socket *, struct aspa_table *, struct pdu_aspa **, size_t, struct aspa_update **)"
                 );
  }
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x42b,
                  "int rtr_compute_update_aspa_table(struct rtr_socket *, struct aspa_table *, struct pdu_aspa **, size_t, struct aspa_update **)"
                 );
  }
  if (update == (aspa_update **)0x0) {
    __assert_fail("update",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x42c,
                  "int rtr_compute_update_aspa_table(struct rtr_socket *, struct aspa_table *, struct pdu_aspa **, size_t, struct aspa_update **)"
                 );
  }
  if ((update == (aspa_update **)0x0) || ((pdu_count != 0 && (aspa_pdus == (pdu_aspa **)0x0)))) {
    rtr_socket_local._4_4_ = -1;
  }
  else if (pdu_count == 0) {
    rtr_socket_local._4_4_ = 0;
  }
  else {
    operations_00 = (aspa_update_operation *)lrtr_malloc(pdu_count * 0x30);
    if (operations_00 == (aspa_update_operation *)0x0) {
      builtin_strncpy(local_1e,"Malloc f",8);
      builtin_strncpy(txt,"ailed",6);
      lrtr_dbg("RTR Socket: %s",local_1e);
      rtr_send_error_pdu_from_host(rtr_socket,(void *)0x0,0,INTERNAL_ERROR,local_1e,0xe);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
    }
    else {
      for (uStack_88 = 0; uStack_88 < pdu_count; uStack_88 = uStack_88 + 1) {
        local_b0 = aspa_pdus[uStack_88];
        operations_00[uStack_88].type = (local_b0->flags & 1) == 1;
        operations_00[uStack_88].is_no_op = false;
        operations_00[uStack_88].record.customer_asn = local_b0->customer_asn;
        if (operations_00[uStack_88].type == ASPA_ADD) {
          local_a4 = (uint)local_b0->provider_count;
        }
        else {
          local_a4 = 0;
        }
        operations_00[uStack_88].record.provider_count = (long)(int)local_a4;
        if (operations_00[uStack_88].type == ASPA_ADD) {
          local_b0 = local_b0 + 1;
        }
        else {
          local_b0 = (pdu_aspa *)0x0;
        }
        operations_00[uStack_88].record.provider_asns = (uint32_t *)local_b0;
        operations_00[uStack_88].index = uStack_88;
      }
      aVar1 = aspa_table_update_swap_in_compute
                        (aspa_table,rtr_socket,operations_00,pdu_count,update);
      if ((*update == (aspa_update *)0x0) ||
         ((*update)->failed_operation == (aspa_update_operation *)0x0)) {
        if (aVar1 != ASPA_SUCCESS) {
          builtin_strncpy(local_38,"aspa_tab",8);
          builtin_strncpy(txt_1,"le Error",9);
          lrtr_dbg("RTR Socket: %s",local_38);
          rtr_send_error_pdu_from_host(rtr_socket,(void *)0x0,0,INTERNAL_ERROR,local_38,0x11);
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
          rtr_socket_local._4_4_ = -1;
          goto LAB_0010ffa2;
        }
      }
      else {
        pdu_00 = aspa_pdus[(*update)->failed_operation->index];
        sVar2 = rtr_size_of_aspa_pdu(pdu_00);
        if (aVar1 == ASPA_DUPLICATE_RECORD) {
          lrtr_dbg("RTR Socket: Duplicate Announcement for ASPA customer ASN: %u received",
                   (ulong)pdu_00->customer_asn);
          rtr_send_error_pdu_from_host
                    (rtr_socket,pdu_00,(uint32_t)sVar2,DUPLICATE_ANNOUNCEMENT,(char *)0x0,0);
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
          rtr_socket_local._4_4_ = -1;
          goto LAB_0010ffa2;
        }
        if (aVar1 == ASPA_RECORD_NOT_FOUND) {
          lrtr_dbg("RTR Socket: Withdrawal of unknown ASPA customer ASN: %u",
                   (ulong)pdu_00->customer_asn);
          rtr_send_error_pdu_from_host
                    (rtr_socket,pdu_00,(uint32_t)sVar2,WITHDRAWAL_OF_UNKNOWN_RECORD,(char *)0x0,0);
          rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
          rtr_socket_local._4_4_ = -1;
          goto LAB_0010ffa2;
        }
      }
      lrtr_dbg("RTR Socket: ASPA update computed");
      rtr_socket_local._4_4_ = 0;
    }
  }
LAB_0010ffa2:
  if (*(long *)(in_FS_OFFSET + 0x28) == txt._6_8_) {
    return rtr_socket_local._4_4_;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_compute_update_aspa_table(struct rtr_socket *rtr_socket, struct aspa_table *aspa_table,
					 struct pdu_aspa **aspa_pdus, size_t pdu_count, struct aspa_update **update)
{
	// Fail hard in debug builds.
	assert(rtr_socket);
	assert(aspa_table);
	assert(update);

	if (!update || (pdu_count > 0 && !aspa_pdus))
		return RTR_ERROR;

	if (pdu_count == 0)
		return RTR_SUCCESS;

	struct aspa_update_operation *operations = lrtr_malloc(sizeof(struct aspa_update_operation) * pdu_count);

	if (!operations) {
		const char txt[] = "Malloc failed";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	for (size_t i = 0; i < pdu_count; i++) {
		rtr_aspa_pdu_2_aspa_operation(aspa_pdus[i], &operations[i]);
		operations[i].index = i;
	}

	enum aspa_status res = aspa_table_update_swap_in_compute(aspa_table, rtr_socket, operations, pdu_count, update);

	if (*update && (*update)->failed_operation) {
		struct pdu_aspa *pdu = aspa_pdus[(*update)->failed_operation->index];
		size_t pdu_size = rtr_size_of_aspa_pdu(pdu);

		if (res == ASPA_DUPLICATE_RECORD) {
			RTR_DBG("Duplicate Announcement for ASPA customer ASN: %u received", pdu->customer_asn);
			rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, DUPLICATE_ANNOUNCEMENT, NULL, 0);
			rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
			return RTR_ERROR;
		} else if (res == ASPA_RECORD_NOT_FOUND) {
			RTR_DBG("Withdrawal of unknown ASPA customer ASN: %u", pdu->customer_asn);
			rtr_send_error_pdu_from_host(rtr_socket, pdu, pdu_size, WITHDRAWAL_OF_UNKNOWN_RECORD, NULL, 0);
			rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
			return RTR_ERROR;
		}
	} else if (res != ASPA_SUCCESS) {
		const char txt[] = "aspa_table Error";

		RTR_DBG("%s", txt);
		rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		return RTR_ERROR;
	}

	RTR_DBG1("ASPA update computed");
	return RTR_SUCCESS;
}